

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.h
# Opt level: O2

void __thiscall booster::locale::ios_info::string_set::set<char>(string_set *this,char *s)

{
  char *pcVar1;
  void *__dest;
  ulong __n;
  
  if (*(void **)(this + 0x10) != (void *)0x0) {
    operator_delete__(*(void **)(this + 0x10));
  }
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined **)this = &char::typeinfo;
  __n = 0;
  do {
    pcVar1 = s + __n;
    __n = __n + 1;
  } while (*pcVar1 != '\0');
  *(ulong *)(this + 8) = __n;
  __dest = operator_new__(__n);
  *(void **)(this + 0x10) = __dest;
  memcpy(__dest,s,__n);
  return;
}

Assistant:

void set(Char const *s)
                {
                    delete [] ptr;
                    ptr = 0;
                    type=&typeid(Char);
                    Char const *end = s;
                    while(*end!=0) end++;
                    // if ptr = 0 it does not matter what is value of size
                    size = sizeof(Char)*(end - s+1);
                    ptr = new char[size];
                    memcpy(ptr,s,size);
                }